

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_inst.c
# Opt level: O0

func_type * get_block_type(func_type *__return_storage_ptr__,vm *v,int32 bt)

{
  undefined4 uVar1;
  type_pointer pfVar2;
  int32 bt_local;
  vm *v_local;
  
  *(undefined8 *)__return_storage_ptr__ = 0;
  __return_storage_ptr__->param_types = (byte *)0x0;
  *(undefined8 *)&__return_storage_ptr__->return_count = 1;
  __return_storage_ptr__->return_types = (byte *)0x0;
  if (bt < 0) {
    switch(bt) {
    case -4:
      __return_storage_ptr__->param_types = fiveBlockReturnType + 3;
      break;
    case -3:
      __return_storage_ptr__->param_types = fiveBlockReturnType + 2;
      break;
    case -2:
      __return_storage_ptr__->param_types = fiveBlockReturnType + 1;
      break;
    case -1:
      __return_storage_ptr__->param_types = fiveBlockReturnType;
      break;
    default:
      __return_storage_ptr__->return_count = 0;
    }
  }
  else {
    pfVar2 = (v->m->type_sec).type_segment_addr + bt;
    uVar1 = *(undefined4 *)&pfVar2->field_0x4;
    __return_storage_ptr__->param_count = pfVar2->param_count;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = uVar1;
    __return_storage_ptr__->param_types = pfVar2->param_types;
    uVar1 = *(undefined4 *)&pfVar2->field_0x14;
    __return_storage_ptr__->return_count = pfVar2->return_count;
    *(undefined4 *)&__return_storage_ptr__->field_0x14 = uVar1;
    __return_storage_ptr__->return_types = pfVar2->return_types;
  }
  return __return_storage_ptr__;
}

Assistant:

func_type get_block_type(vm *v, int32 bt) {
    struct func_type block_type = {
            .param_count=0,
            .return_count=1,
            .return_types=NULL,
            .param_types=NULL
    };
    if (bt < 0) {
        switch (bt) {
            case BlockTypeI32:
                block_type.param_types = &fiveBlockReturnType[0];
                break;
            case BlockTypeI64:
                block_type.param_types = &fiveBlockReturnType[1];
                break;
            case BlockTypeF32:
                block_type.param_types = &fiveBlockReturnType[2];
                break;
            case BlockTypeF64:
                block_type.param_types = &fiveBlockReturnType[3];
                break;
            default:
                block_type.return_count = 0;
                break;
        }
    } else {
        block_type = *(v->m->type_sec.type_segment_addr + bt);
    }
    return block_type;
}